

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  GeneratedMessageFactory *pGVar1;
  LogMessage *pLVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false,_false>,_bool>
  pVar3;
  __node_gen_type __node_gen;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *local_50;
  Descriptor *local_48;
  Message *local_40;
  
  pGVar1 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_50 = &pGVar1->type_map_;
  local_48 = descriptor;
  local_40 = prototype;
  pVar3 = std::
          _Hashtable<google::protobuf::Descriptor_const*,std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>,std::__detail::_Select1st,std::equal_to<google::protobuf::Descriptor_const*>,std::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_insert<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>,false>>>>
                    ();
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x256);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_48,"Type is already registered: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(descriptor + 8));
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}